

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

int __thiscall QCompletionModel::completionCount(QCompletionModel *this)

{
  int iVar1;
  QCompletionEngine *pQVar2;
  QCompletionEngine *in_RDI;
  QCompletionEngine *this_00;
  int local_4;
  
  this_00 = in_RDI;
  QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
            ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
             &(in_RDI->curMatch).indices.vector.d.ptr);
  iVar1 = QCompletionEngine::matchCount(this_00);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    pQVar2 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::
             operator->((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                         *)&(in_RDI->curMatch).indices.vector.d.ptr);
    (*pQVar2->_vptr_QCompletionEngine[2])(pQVar2,0x7fffffff);
    QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
              ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
               &(in_RDI->curMatch).indices.vector.d.ptr);
    local_4 = QCompletionEngine::matchCount(this_00);
  }
  return local_4;
}

Assistant:

int QCompletionModel::completionCount() const
{
    if (!engine->matchCount())
        return 0;

    engine->filterOnDemand(INT_MAX);
    return engine->matchCount();
}